

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

int luaE_resetthread(lua_State *L,int status)

{
  int errcode;
  CallInfo *ci;
  int status_local;
  lua_State *L_local;
  
  L->ci = &L->base_ci;
  *(undefined1 *)((L->stack).offset + 8) = 0;
  (L->base_ci).func = L->stack;
  (L->base_ci).callstatus = 2;
  ci._4_4_ = status;
  if (status == 1) {
    ci._4_4_ = 0;
  }
  L->status = '\0';
  errcode = luaD_closeprotected(L,1,ci._4_4_);
  if (errcode == 0) {
    (L->top).p = (StkId)((L->stack).offset + 0x10);
  }
  else {
    luaD_seterrorobj(L,errcode,(StkId)((L->stack).offset + 0x10));
  }
  (L->base_ci).top.p = (StkId)((L->top).offset + 0x140);
  luaD_reallocstack(L,(int)((long)(L->base_ci).top.p - (L->stack).offset >> 4),0);
  return errcode;
}

Assistant:

int luaE_resetthread (lua_State *L, int status) {
  CallInfo *ci = L->ci = &L->base_ci;  /* unwind CallInfo list */
  setnilvalue(s2v(L->stack.p));  /* 'function' entry for basic 'ci' */
  ci->func.p = L->stack.p;
  ci->callstatus = CIST_C;
  if (status == LUA_YIELD)
    status = LUA_OK;
  L->status = LUA_OK;  /* so it can run __close metamethods */
  status = luaD_closeprotected(L, 1, status);
  if (status != LUA_OK)  /* errors? */
    luaD_seterrorobj(L, status, L->stack.p + 1);
  else
    L->top.p = L->stack.p + 1;
  ci->top.p = L->top.p + LUA_MINSTACK;
  luaD_reallocstack(L, cast_int(ci->top.p - L->stack.p), 0);
  return status;
}